

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeClearTable(Btree *p,int iTable,i64 *pnChange)

{
  BtShared *pBt;
  int iVar1;
  
  pBt = p->pBt;
  sqlite3BtreeEnter(p);
  iVar1 = saveAllCursors(pBt,iTable,(BtCursor *)0x0);
  if (iVar1 == 0) {
    if (p->hasIncrblobCur != '\0') {
      invalidateIncrblobCursors(p,iTable,0,1);
    }
    iVar1 = clearDatabasePage(pBt,iTable,0,pnChange);
  }
  sqlite3BtreeLeave(p);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeClearTable(Btree *p, int iTable, i64 *pnChange){
  int rc;
  BtShared *pBt = p->pBt;
  sqlite3BtreeEnter(p);
  assert( p->inTrans==TRANS_WRITE );

  rc = saveAllCursors(pBt, (Pgno)iTable, 0);

  if( SQLITE_OK==rc ){
    /* Invalidate all incrblob cursors open on table iTable (assuming iTable
    ** is the root of a table b-tree - if it is not, the following call is
    ** a no-op).  */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, (Pgno)iTable, 0, 1);
    }
    rc = clearDatabasePage(pBt, (Pgno)iTable, 0, pnChange);
  }
  sqlite3BtreeLeave(p);
  return rc;
}